

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_pedersen_commit
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *blind,
              uint64_t value,secp256k1_generator *value_gen,secp256k1_generator *blind_gen)

{
  int iVar1;
  int overflow;
  secp256k1_ge blind_genp;
  secp256k1_ge value_genp;
  secp256k1_gej rj;
  secp256k1_ge r;
  secp256k1_ge bp;
  int local_27c;
  secp256k1_scalar local_278;
  secp256k1_ge local_258;
  secp256k1_ge local_200;
  secp256k1_gej local_1a8;
  secp256k1_scalar local_128;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  secp256k1_fe_set_b32(&local_200.x,value_gen->data);
  secp256k1_fe_set_b32(&local_200.y,value_gen->data + 0x20);
  local_200.infinity = 0;
  secp256k1_fe_set_b32(&local_258.x,blind_gen->data);
  secp256k1_fe_set_b32(&local_258.y,blind_gen->data + 0x20);
  local_258.infinity = 0;
  secp256k1_scalar_set_b32(&local_278,blind,&local_27c);
  iVar1 = 0;
  if (local_27c == 0) {
    local_128.d[1] = 0;
    local_128.d[2] = 0;
    local_128.d[3] = 0;
    local_128.d[0] = value;
    secp256k1_ecmult_const(&local_1a8,&local_200,&local_128,0x40);
    secp256k1_ecmult_const(&local_108,&local_258,&local_278,0x100);
    if (local_108.infinity == 0) {
      secp256k1_ge_set_gej(&local_88,&local_108);
      secp256k1_gej_add_ge(&local_1a8,&local_1a8,&local_88);
    }
    iVar1 = 0;
    if (local_1a8.infinity == 0) {
      secp256k1_ge_set_gej((secp256k1_ge *)&local_108,&local_1a8);
      secp256k1_pedersen_commitment_save(commit,(secp256k1_ge *)&local_108);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int secp256k1_pedersen_commit(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit, const unsigned char *blind, uint64_t value, const secp256k1_generator* value_gen, const secp256k1_generator* blind_gen) {
    secp256k1_ge value_genp;
    secp256k1_ge blind_genp;
    secp256k1_gej rj;
    secp256k1_ge r;
    secp256k1_scalar sec;
    int overflow;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(blind_gen != NULL);
    secp256k1_generator_load(&value_genp, value_gen);
    secp256k1_generator_load(&blind_genp, blind_gen);
    secp256k1_scalar_set_b32(&sec, blind, &overflow);
    if (!overflow) {
        secp256k1_pedersen_ecmult(&rj, &sec, value, &value_genp, &blind_genp);
        if (!secp256k1_gej_is_infinity(&rj)) {
            secp256k1_ge_set_gej(&r, &rj);
            secp256k1_pedersen_commitment_save(commit, &r);
            ret = 1;
        }
        secp256k1_gej_clear(&rj);
        secp256k1_ge_clear(&r);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}